

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall CS248::DynamicScene::Scene::selectNextHalfedge(Scene *this)

{
  Halfedge *pHVar1;
  HalfedgeElement *in_RDI;
  Halfedge *h;
  
  if ((in_RDI[7]._vptr_HalfedgeElement != (_func_int **)0x0) &&
     (pHVar1 = HalfedgeElement::getHalfedge(in_RDI), pHVar1 != (Halfedge *)0x0)) {
    Halfedge::next(pHVar1);
    pHVar1 = elementAddress((HalfedgeIter)0x2018c1);
    in_RDI[7]._vptr_HalfedgeElement = (_func_int **)pHVar1;
  }
  return;
}

Assistant:

void Scene::selectNextHalfedge() {
  if (selected.element) {
    Halfedge *h = selected.element->getHalfedge();
    if (h) {
      selected.element = elementAddress(h->next());
    }
  }
}